

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O1

vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
* __thiscall
absl::cord_internal::CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles
          (vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
           *__return_storage_ptr__,CordzHandle *this)

{
  pointer *pppCVar1;
  iterator __position;
  CordzHandle *local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->is_snapshot_ == true) {
    anon_unknown_0::GlobalQueue();
    Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    for (local_18 = this->dq_next_; local_18 != (CordzHandle *)0x0; local_18 = local_18->dq_next_) {
      if (local_18->is_snapshot_ == false) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<absl::cord_internal::CordzHandle_const*,std::allocator<absl::cord_internal::CordzHandle_const*>>
          ::_M_realloc_insert<absl::cord_internal::CordzHandle_const*const&>
                    ((vector<absl::cord_internal::CordzHandle_const*,std::allocator<absl::cord_internal::CordzHandle_const*>>
                      *)__return_storage_ptr__,__position,&local_18);
        }
        else {
          *__position._M_current = local_18;
          pppCVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
    }
    Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const CordzHandle*>
CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles() {
  std::vector<const CordzHandle*> handles;
  if (!is_snapshot()) {
    return handles;
  }

  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = dq_next_; p != nullptr; p = p->dq_next_) {
    if (!p->is_snapshot()) {
      handles.push_back(p);
    }
  }
  return handles;
}